

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O3

void NULLC::TraceSetEnabled(bool enabled)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  
  lVar2 = traceContext;
  if ((bool)*(char *)(traceContext + 0x240) != enabled) {
    if (enabled) {
      *(undefined1 *)(traceContext + 0x240) = 1;
      *(undefined4 *)(lVar2 + 0x270) = 0;
      *(undefined4 *)(lVar2 + 0x260) = 0;
      if (*(long *)(lVar2 + 0x220) == 0) {
        TraceArray<char>::Resize((TraceArray<char> *)(lVar2 + 0x280),0x8000);
        TraceArray<char>::Resize((TraceArray<char> *)(lVar2 + 0x290),0x400);
        uVar3 = (**(code **)(lVar2 + 0x228))("trace.json");
        *(undefined8 *)(lVar2 + 0x220) = uVar3;
        *(long *)(lVar2 + 0x100) = *(long *)(lVar2 + 0x288);
        uVar1 = *(uint *)(lVar2 + 0x10c);
        *(undefined4 *)(lVar2 + 0x108) = *(undefined4 *)(lVar2 + 0x284);
        *(undefined8 *)(lVar2 + 0x210) = *(undefined8 *)(lVar2 + 0x298);
        *(undefined4 *)(lVar2 + 0x218) = *(undefined4 *)(lVar2 + 0x294);
        *(uint *)(lVar2 + 0x10c) = uVar1 + 1;
        *(undefined1 *)(*(long *)(lVar2 + 0x288) + (ulong)uVar1) = 0x5b;
        if (*(int *)(lVar2 + 0x10c) == *(int *)(lVar2 + 0x108)) {
          (**(code **)(lVar2 + 0x230))
                    (*(undefined8 *)(lVar2 + 0x220),*(undefined8 *)(lVar2 + 0x100));
          *(undefined4 *)(lVar2 + 0x10c) = 0;
        }
        TraceArray<char>::Resize((TraceArray<char> *)(lVar2 + 0x260),0x40000);
        TraceArray<NULLC::TraceEvent>::Resize
                  ((TraceArray<NULLC::TraceEvent> *)(lVar2 + 0x270),0x20000);
        return;
      }
    }
    else {
      *(undefined1 *)(traceContext + 0x240) = 0;
      TraceDump();
      if (*(int *)(lVar2 + 0x10c) != 0) {
        (**(code **)(lVar2 + 0x230))(*(undefined8 *)(lVar2 + 0x220),*(undefined8 *)(lVar2 + 0x100));
      }
      *(undefined4 *)(lVar2 + 0x10c) = 0;
    }
  }
  return;
}

Assistant:

inline void TraceSetEnabled(bool enabled)
	{
		TraceContext &context = *traceContext;

		if(context.outputEnabled == enabled)
			return;

		if(enabled)
		{
			context.outputEnabled = true;

			// Clear what was already recorded
			context.events.count = 0;
			context.labels.count = 0;

			if(!context.output.stream)
			{
				context.outputBuf.Resize(32768);
				context.tempBuf.Resize(1024);

				context.output.stream = context.output.openStream("trace.json");

				context.output.outputBuf = context.outputBuf.data;
				context.output.outputBufSize = context.outputBuf.max;

				context.output.tempBuf = context.tempBuf.data;
				context.output.tempBufSize = context.tempBuf.max;

				context.output.Print('[');

				context.labels.Resize(262144);
				context.events.Resize(131072);
			}
		}
		else
		{
			context.outputEnabled = false;

			TraceDump();

			context.output.Flush();
		}
	}